

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
server_metrics::on_decoded
          (server_metrics *this,vector<server_slot,_std::allocator<server_slot>_> *slots)

{
  pointer psVar1;
  server_slot *slot;
  pointer psVar2;
  uint64_t uVar3;
  
  this->n_decode_total = this->n_decode_total + 1;
  psVar1 = (slots->super__Vector_base<server_slot,_std::allocator<server_slot>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = this->n_busy_slots_total;
  for (psVar2 = (slots->super__Vector_base<server_slot,_std::allocator<server_slot>_>)._M_impl.
                super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    if (psVar2->state != SLOT_STATE_IDLE) {
      uVar3 = uVar3 + 1;
      this->n_busy_slots_total = uVar3;
    }
  }
  return;
}

Assistant:

void on_decoded(const std::vector<server_slot> & slots) {
        n_decode_total++;
        for (const auto & slot : slots) {
            if (slot.is_processing()) {
                n_busy_slots_total++;
            }
        }
    }